

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void AddSingleLiteral(uint32_t pixel,int use_color_cache,VP8LColorCache *hashers,
                     VP8LBackwardRefs *refs)

{
  uint32_t key_00;
  uint32_t uVar1;
  PixOrCopy PVar2;
  VP8LColorCache *in_RDX;
  int in_ESI;
  uint32_t in_EDI;
  uint32_t key;
  PixOrCopy v;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  
  if (in_ESI == 0) {
    PVar2 = PixOrCopyCreateLiteral(in_EDI);
    in_stack_ffffffffffffffc4 = PVar2._0_4_;
  }
  else {
    key_00 = VP8LColorCacheGetIndex
                       ((VP8LColorCache *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    uVar1 = VP8LColorCacheLookup(in_RDX,key_00);
    if (uVar1 == in_EDI) {
      PixOrCopyCreateCacheIdx(key_00);
    }
    else {
      PixOrCopyCreateLiteral(in_EDI);
      VP8LColorCacheSet(in_RDX,key_00,in_EDI);
    }
  }
  PVar2.argb_or_distance = in_stack_ffffffffffffffc4;
  PVar2.mode = (char)in_stack_ffffffffffffffc0;
  PVar2._1_1_ = (char)((uint)in_stack_ffffffffffffffc0 >> 8);
  PVar2.len = (short)((uint)in_stack_ffffffffffffffc0 >> 0x10);
  VP8LBackwardRefsCursorAdd
            ((VP8LBackwardRefs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),PVar2
            );
  return;
}

Assistant:

static WEBP_INLINE void AddSingleLiteral(uint32_t pixel, int use_color_cache,
                                         VP8LColorCache* const hashers,
                                         VP8LBackwardRefs* const refs) {
  PixOrCopy v;
  if (use_color_cache) {
    const uint32_t key = VP8LColorCacheGetIndex(hashers, pixel);
    if (VP8LColorCacheLookup(hashers, key) == pixel) {
      v = PixOrCopyCreateCacheIdx(key);
    } else {
      v = PixOrCopyCreateLiteral(pixel);
      VP8LColorCacheSet(hashers, key, pixel);
    }
  } else {
    v = PixOrCopyCreateLiteral(pixel);
  }
  VP8LBackwardRefsCursorAdd(refs, v);
}